

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

_Bool sum_binary(_Bool *a,_Bool *b,size_t length,_Bool *result)

{
  _Bool _Var1;
  _Bool _Var2;
  byte bVar3;
  byte bVar4;
  size_t sVar5;
  
  bVar4 = 0;
  if (length != 0) {
    sVar5 = 0;
    do {
      _Var1 = b[sVar5];
      _Var2 = a[sVar5];
      result[sVar5] = (_Bool)((bVar4 ^ _Var1 != _Var2) & 1);
      bVar3 = _Var1 != _Var2 & bVar4;
      bVar4 = 1;
      if (bVar3 == 0) {
        if (a[sVar5] == true) {
          bVar4 = b[sVar5];
        }
        else {
          bVar4 = 0;
        }
      }
      sVar5 = sVar5 + 1;
    } while (length != sVar5);
  }
  return (_Bool)bVar4;
}

Assistant:

bool sum_binary(const bool* a, const bool* b, const size_t length, bool* result) {
  bool carry = false;
  for (size_t n = 0; n < length; n++) {
    bool a_xor_b = (a[n] || b[n]) && !(a[n] && b[n]); // a ^ b
    result[n] = (a_xor_b || carry) && !(a_xor_b && carry); // (a ^ b) ^ carry
    carry = (a_xor_b && carry) || (a[n] && b[n]); // (a ^ b) ^ carry | a & b
  }
  return carry;
}